

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

string * __thiscall
gvr::(anonymous_namespace)::PLYProperty::type2Name_abi_cxx11_
          (string *__return_storage_ptr__,PLYProperty *this,ply_type type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar2 = "int8";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "uint8";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "int16";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "uint16";
    paVar1 = &local_c;
    break;
  case 5:
    pcVar2 = "int32";
    paVar1 = &local_d;
    break;
  case 6:
    pcVar2 = "uint32";
    paVar1 = &local_e;
    break;
  case 7:
    pcVar2 = "float32";
    paVar1 = &local_f;
    break;
  case 8:
    pcVar2 = "float64";
    paVar1 = &local_10;
    break;
  default:
    pcVar2 = "none";
    paVar1 = &local_11;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PLYProperty::type2Name(ply_type type)
{
  switch (type)
  {
    case ply_int8:
      return "int8";

    case ply_uint8:
      return "uint8";

    case ply_int16:
      return "int16";

    case ply_uint16:
      return "uint16";

    case ply_int32:
      return "int32";

    case ply_uint32:
      return "uint32";

    case ply_float32:
      return "float32";

    case ply_float64:
      return "float64";

    default:
      break;
  }

  assert(false);

  return "none";
}